

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall Kvm::addBindingToFrame(Kvm *this,Value *var,Value *val,Value *frame)

{
  Value *pVVar1;
  Value *pVVar2;
  Value *local_30;
  Value *result;
  Value *frame_local;
  Value *val_local;
  Value *var_local;
  Kvm *this_local;
  
  local_30 = (Value *)0x0;
  result = frame;
  frame_local = val;
  val_local = var;
  var_local = (Value *)this;
  Kgc::pushLocalStackRoot(&this->gc_,&local_30);
  pVVar1 = val_local;
  pVVar2 = car(result);
  local_30 = makeCell(this,pVVar1,pVVar2);
  set_car(result,local_30);
  pVVar1 = frame_local;
  pVVar2 = cdr(result);
  local_30 = makeCell(this,pVVar1,pVVar2);
  set_cdr(result,local_30);
  Kgc::popLocalStackRoot(&this->gc_);
  return;
}

Assistant:

void Kvm::addBindingToFrame(const Value *var, const Value *val, const Value *frame)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeCell(var, car(frame));
    set_car(const_cast<Value *>(frame), result);
    
    result = makeCell(val, cdr(frame));
    set_cdr(const_cast<Value *>(frame), result);
    
    gc_.popLocalStackRoot();
}